

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sftp_nonblock.c
# Opt level: O3

int main(int argc,char **argv)

{
  char *pcVar1;
  char *pcVar2;
  FILE *__stream;
  in_addr_t iVar3;
  uint uVar4;
  int iVar5;
  int iVar6;
  LIBSSH2_SESSION *session;
  long lVar7;
  size_t sVar8;
  size_t sVar9;
  undefined8 uVar10;
  long lVar11;
  long lVar12;
  long lVar13;
  timeval start;
  sockaddr_in sin;
  timeval end;
  timeval local_6058;
  sockaddr local_6048;
  timeval local_6038 [1536];
  
  iVar3 = 0x100007f;
  if ((1 < argc) && (iVar3 = inet_addr(argv[1]), argc != 2)) {
    username = argv[2];
    if ((3 < (uint)argc) && (password = argv[3], argc != 4)) {
      sftppath = argv[4];
    }
  }
  uVar4 = libssh2_init(0);
  if (uVar4 == 0) {
    iVar5 = socket(2,1,0);
    if (iVar5 == -1) {
      main_cold_5();
    }
    else {
      local_6048.sa_family = 2;
      local_6048.sa_data[0] = '\0';
      local_6048.sa_data[1] = '\x16';
      local_6048.sa_data._2_4_ = iVar3;
      iVar6 = connect(iVar5,&local_6048,0x10);
      if (iVar6 == 0) {
        session = (LIBSSH2_SESSION *)libssh2_session_init_ex(0,0,0,0);
        if (session == (LIBSSH2_SESSION *)0x0) {
          main_cold_4();
        }
        else {
          libssh2_session_set_blocking(session);
          gettimeofday(&local_6058,(__timezone_ptr_t)0x0);
          do {
            uVar4 = libssh2_session_handshake(session,iVar5);
          } while (uVar4 == 0xffffffdb);
          if (uVar4 == 0) {
            lVar7 = libssh2_hostkey_hash(session,2);
            fwrite("Fingerprint: ",0xd,1,_stderr);
            lVar13 = 0;
            do {
              fprintf(_stderr,"%02X ",(ulong)*(byte *)(lVar7 + lVar13));
              lVar13 = lVar13 + 1;
            } while (lVar13 != 0x14);
            fputc(10,_stderr);
            do {
              pcVar1 = username;
              sVar8 = strlen(username);
              pcVar2 = password;
              sVar9 = strlen(password);
              iVar6 = libssh2_userauth_password_ex
                                (session,pcVar1,sVar8 & 0xffffffff,pcVar2,sVar9 & 0xffffffff,0);
            } while (iVar6 == -0x25);
            if (iVar6 == 0) {
              fwrite("libssh2_sftp_init().\n",0x15,1,_stderr);
              lVar7 = libssh2_sftp_init(session);
              while (lVar7 == 0) {
                iVar6 = libssh2_session_last_errno(session);
                if (iVar6 != -0x25) {
                  main_cold_2();
                  goto LAB_001017cd;
                }
                fwrite("non-blocking init\n",0x12,1,_stderr);
                waitsocket(iVar5,session);
                lVar7 = libssh2_sftp_init(session);
              }
              fwrite("libssh2_sftp_open().\n",0x15,1,_stderr);
              pcVar1 = sftppath;
              sVar8 = strlen(sftppath);
              uVar4 = 0;
              lVar13 = libssh2_sftp_open_ex(lVar7,pcVar1,sVar8 & 0xffffffff,1,0,0);
              while (lVar13 == 0) {
                iVar6 = libssh2_session_last_errno(session);
                __stream = _stderr;
                if (iVar6 != -0x25) {
                  uVar10 = libssh2_sftp_last_error(lVar7);
                  fprintf(__stream,"Unable to open file with SFTP: %ld\n",uVar10);
                  goto LAB_001017cd;
                }
                fwrite("non-blocking open\n",0x12,1,_stderr);
                waitsocket(iVar5,session);
                pcVar1 = sftppath;
                sVar8 = strlen(sftppath);
                lVar13 = libssh2_sftp_open_ex(lVar7,pcVar1,sVar8 & 0xffffffff,1,0,0);
              }
              fwrite("libssh2_sftp_open() is done, now receive data.\n",0x2f,1,_stderr);
              lVar12 = 0;
              while( true ) {
                while (sVar8 = libssh2_sftp_read(lVar13,local_6038,0x6000),
                      sVar8 == 0xffffffffffffffdb) {
                  uVar4 = uVar4 + 1;
                  waitsocket(iVar5,session);
                }
                if ((long)sVar8 < 1) break;
                lVar12 = lVar12 + sVar8;
                write(1,local_6038,sVar8);
              }
              gettimeofday(local_6038,(__timezone_ptr_t)0x0);
              lVar11 = (local_6038[0].tv_usec - local_6058.tv_usec) / 1000 +
                       (local_6038[0].tv_sec - local_6058.tv_sec) * 1000;
              fprintf(_stderr,"Got %ld bytes in %ld ms = %.1f bytes/sec spin: %d\n",
                      (double)lVar12 / ((double)lVar11 / 1000.0),lVar12,lVar11,(ulong)uVar4);
              libssh2_sftp_close_handle(lVar13);
              libssh2_sftp_shutdown(lVar7);
            }
            else {
              main_cold_3();
            }
          }
          else {
            fprintf(_stderr,"Failure establishing SSH session: %d\n",(ulong)uVar4);
          }
LAB_001017cd:
          fwrite("libssh2_session_disconnect\n",0x1b,1,_stderr);
          do {
            iVar6 = libssh2_session_disconnect_ex(session,0xb,"Normal Shutdown","");
          } while (iVar6 == -0x25);
          libssh2_session_free(session);
        }
      }
      else {
        main_cold_1();
      }
      shutdown(iVar5,2);
      close(iVar5);
    }
    fwrite("all done\n",9,1,_stderr);
    libssh2_exit();
    iVar5 = 0;
  }
  else {
    fprintf(_stderr,"libssh2 initialization failed (%d)\n",(ulong)uVar4);
    iVar5 = 1;
  }
  return iVar5;
}

Assistant:

int main(int argc, char *argv[])
{
    uint32_t hostaddr;
    libssh2_socket_t sock;
    int i, auth_pw = 1;
    struct sockaddr_in sin;
    const char *fingerprint;
    int rc;
    LIBSSH2_SESSION *session = NULL;
    LIBSSH2_SFTP *sftp_session;
    LIBSSH2_SFTP_HANDLE *sftp_handle;
#ifdef HAVE_GETTIMEOFDAY
    struct timeval start;
    struct timeval end;
    long time_ms;
#endif
    libssh2_struct_stat_size total = 0;
    int spin = 0;

#ifdef _WIN32
    WSADATA wsadata;

    rc = WSAStartup(MAKEWORD(2, 0), &wsadata);
    if(rc) {
        fprintf(stderr, "WSAStartup failed with error: %d\n", rc);
        return 1;
    }
#endif

    if(argc > 1) {
        hostaddr = inet_addr(argv[1]);
    }
    else {
        hostaddr = htonl(0x7F000001);
    }
    if(argc > 2) {
        username = argv[2];
    }
    if(argc > 3) {
        password = argv[3];
    }
    if(argc > 4) {
        sftppath = argv[4];
    }

    rc = libssh2_init(0);
    if(rc) {
        fprintf(stderr, "libssh2 initialization failed (%d)\n", rc);
        return 1;
    }

    /*
     * The application code is responsible for creating the socket
     * and establishing the connection
     */
    sock = socket(AF_INET, SOCK_STREAM, 0);
    if(sock == LIBSSH2_INVALID_SOCKET) {
        fprintf(stderr, "failed to create socket.\n");
        goto shutdown;
    }

    sin.sin_family = AF_INET;
    sin.sin_port = htons(22);
    sin.sin_addr.s_addr = hostaddr;
    if(connect(sock, (struct sockaddr*)(&sin), sizeof(struct sockaddr_in))) {
        fprintf(stderr, "failed to connect.\n");
        goto shutdown;
    }

    /* Create a session instance */
    session = libssh2_session_init();
    if(!session) {
        fprintf(stderr, "Could not initialize SSH session.\n");
        goto shutdown;
    }

    /* Since we have set non-blocking, tell libssh2 we are non-blocking */
    libssh2_session_set_blocking(session, 0);

#ifdef HAVE_GETTIMEOFDAY
    gettimeofday(&start, NULL);
#endif

    /* ... start it up. This will trade welcome banners, exchange keys,
     * and setup crypto, compression, and MAC layers
     */
    while((rc = libssh2_session_handshake(session, sock)) ==
          LIBSSH2_ERROR_EAGAIN);
    if(rc) {
        fprintf(stderr, "Failure establishing SSH session: %d\n", rc);
        goto shutdown;
    }

    /* At this point we have not yet authenticated.  The first thing to do
     * is check the hostkey's fingerprint against our known hosts Your app
     * may have it hard coded, may go to a file, may present it to the
     * user, that's your call
     */
    fingerprint = libssh2_hostkey_hash(session, LIBSSH2_HOSTKEY_HASH_SHA1);
    fprintf(stderr, "Fingerprint: ");
    for(i = 0; i < 20; i++) {
        fprintf(stderr, "%02X ", (unsigned char)fingerprint[i]);
    }
    fprintf(stderr, "\n");

    if(auth_pw) {
        /* We could authenticate via password */
        while((rc = libssh2_userauth_password(session, username, password)) ==
              LIBSSH2_ERROR_EAGAIN);
        if(rc) {
            fprintf(stderr, "Authentication by password failed.\n");
            goto shutdown;
        }
    }
    else {
        /* Or by public key */
        while((rc =
              libssh2_userauth_publickey_fromfile(session, username,
                                                  pubkey, privkey,
                                                  password)) ==
              LIBSSH2_ERROR_EAGAIN);
        if(rc) {
            fprintf(stderr, "Authentication by public key failed.\n");
            goto shutdown;
        }
    }
#if 0
    libssh2_trace(session, LIBSSH2_TRACE_CONN);
#endif
    fprintf(stderr, "libssh2_sftp_init().\n");
    do {
        sftp_session = libssh2_sftp_init(session);

        if(!sftp_session) {
            if(libssh2_session_last_errno(session) == LIBSSH2_ERROR_EAGAIN) {
                fprintf(stderr, "non-blocking init\n");
                waitsocket(sock, session); /* now we wait */
            }
            else {
                fprintf(stderr, "Unable to init SFTP session\n");
                goto shutdown;
            }
        }
    } while(!sftp_session);

    fprintf(stderr, "libssh2_sftp_open().\n");
    /* Request a file via SFTP */
    do {
        sftp_handle = libssh2_sftp_open(sftp_session, sftppath,
                                        LIBSSH2_FXF_READ, 0);
        if(!sftp_handle) {
            if(libssh2_session_last_errno(session) != LIBSSH2_ERROR_EAGAIN) {
                fprintf(stderr, "Unable to open file with SFTP: %ld\n",
                        libssh2_sftp_last_error(sftp_session));
                goto shutdown;
            }
            else {
                fprintf(stderr, "non-blocking open\n");
                waitsocket(sock, session); /* now we wait */
            }
        }
    } while(!sftp_handle);

    fprintf(stderr, "libssh2_sftp_open() is done, now receive data.\n");
    do {
        char mem[1024 * 24];
        ssize_t nread;

        /* loop until we fail */
        while((nread = libssh2_sftp_read(sftp_handle, mem, sizeof(mem))) ==
              LIBSSH2_ERROR_EAGAIN) {
            spin++;
            waitsocket(sock, session); /* now we wait */
        }
        if(nread > 0) {
            total += nread;
            write(1, mem, (size_t)nread);
        }
        else {
            break;
        }
    } while(1);

#ifdef HAVE_GETTIMEOFDAY
    gettimeofday(&end, NULL);
    time_ms = tvdiff(end, start);
    fprintf(stderr, "Got %ld bytes in %ld ms = %.1f bytes/sec spin: %d\n",
            (long)total, time_ms,
            (double)total / ((double)time_ms / 1000.0), spin);
#else
    fprintf(stderr, "Got %ld bytes spin: %d\n", (long)total, spin);
#endif

    libssh2_sftp_close(sftp_handle);
    libssh2_sftp_shutdown(sftp_session);

shutdown:

    if(session) {
        fprintf(stderr, "libssh2_session_disconnect\n");
        while(libssh2_session_disconnect(session, "Normal Shutdown") ==
              LIBSSH2_ERROR_EAGAIN);
        libssh2_session_free(session);
    }

    if(sock != LIBSSH2_INVALID_SOCKET) {
        shutdown(sock, 2);
        LIBSSH2_SOCKET_CLOSE(sock);
    }

    fprintf(stderr, "all done\n");

    libssh2_exit();

#ifdef _WIN32
    WSACleanup();
#endif

    return 0;
}